

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

void GPU_VectorApplyMatrix(float *vec3,float *matrix_4x4)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  
  fVar1 = *vec3;
  fVar2 = vec3[1];
  fVar3 = vec3[2];
  fVar4 = matrix_4x4[6];
  fVar5 = matrix_4x4[2];
  fVar6 = matrix_4x4[10];
  fVar7 = matrix_4x4[0xe];
  fVar10 = matrix_4x4[0xb] * fVar3 + matrix_4x4[3] * fVar1 + matrix_4x4[7] * fVar2 + matrix_4x4[0xf]
  ;
  auVar8._0_4_ = fVar3 * (float)*(undefined8 *)(matrix_4x4 + 8) +
                 fVar1 * (float)*(undefined8 *)matrix_4x4 +
                 (float)*(undefined8 *)(matrix_4x4 + 4) * fVar2 +
                 (float)*(undefined8 *)(matrix_4x4 + 0xc);
  auVar8._4_4_ = fVar3 * (float)((ulong)*(undefined8 *)(matrix_4x4 + 8) >> 0x20) +
                 fVar1 * (float)((ulong)*(undefined8 *)matrix_4x4 >> 0x20) +
                 (float)((ulong)*(undefined8 *)(matrix_4x4 + 4) >> 0x20) * fVar2 +
                 (float)((ulong)*(undefined8 *)(matrix_4x4 + 0xc) >> 0x20);
  auVar8._8_4_ = fVar1 * 0.0 + fVar2 * 0.0 + 0.0 + 0.0;
  auVar8._12_4_ = fVar1 * 0.0 + fVar2 * 0.0 + 0.0 + 0.0;
  auVar9._4_4_ = fVar10;
  auVar9._0_4_ = fVar10;
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar8,auVar9);
  *(long *)vec3 = auVar9._0_8_;
  vec3[2] = (fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7) / fVar10;
  return;
}

Assistant:

void GPU_VectorApplyMatrix(float* vec3, const float* matrix_4x4)
{
	float x = matrix_4x4[0] * vec3[0] + matrix_4x4[4] * vec3[1] + matrix_4x4[8] * vec3[2] + matrix_4x4[12];
	float y = matrix_4x4[1] * vec3[0] + matrix_4x4[5] * vec3[1] + matrix_4x4[9] * vec3[2] + matrix_4x4[13];
	float z = matrix_4x4[2] * vec3[0] + matrix_4x4[6] * vec3[1] + matrix_4x4[10] * vec3[2] + matrix_4x4[14];
	float w = matrix_4x4[3] * vec3[0] + matrix_4x4[7] * vec3[1] + matrix_4x4[11] * vec3[2] + matrix_4x4[15];
	vec3[0] = x / w;
	vec3[1] = y / w;
	vec3[2] = z / w;
}